

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O1

QJsonObject __thiscall FunctionDef::toJson(FunctionDef *this,int index)

{
  bool bVar1;
  storage_type *in_RCX;
  int in_EDX;
  long lVar2;
  undefined4 in_register_00000034;
  long lVar3;
  ArgumentDef *arg;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QLatin1StringView key;
  QLatin1StringView key_00;
  QLatin1StringView key_01;
  QLatin1StringView key_02;
  QLatin1StringView key_03;
  QLatin1StringView key_04;
  QLatin1StringView key_05;
  QLatin1StringView key_06;
  QJsonArray args;
  QJsonValueConstRef local_78;
  QCborContainerPrivate *local_68;
  long local_38;
  
  lVar3 = CONCAT44(in_register_00000034,index);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->type).name.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QJsonObject::QJsonObject((QJsonObject *)this);
  ba.m_data = in_RCX;
  ba.m_size = *(qsizetype *)(lVar3 + 0x90);
  QString::fromUtf8((QString *)&stack0xffffffffffffff98,*(QString **)(lVar3 + 0x98),ba);
  QJsonValue::QJsonValue((QJsonValue *)&stack0xffffffffffffffb0,(QString *)&stack0xffffffffffffff98)
  ;
  key.m_size = 4;
  key.m_data = "name";
  local_78 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)this,key);
  QJsonValueRef::operator=((QJsonValueRef *)&local_78,(QJsonValue *)&stack0xffffffffffffffb0);
  QJsonValue::~QJsonValue((QJsonValue *)&stack0xffffffffffffffb0);
  if (local_68 != (QCborContainerPrivate *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&local_68->super_QSharedData)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)&local_68->super_QSharedData)->_q_value).super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&local_68->super_QSharedData)->_q_value).super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate((QArrayData *)local_68,2,0x10);
    }
  }
  QJsonValue::QJsonValue((QJsonValue *)&stack0xffffffffffffffb0,in_EDX);
  key_00.m_size = 5;
  key_00.m_data = "index";
  _local_68 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)this,key_00);
  QJsonValueRef::operator=
            ((QJsonValueRef *)&stack0xffffffffffffff98,(QJsonValue *)&stack0xffffffffffffffb0);
  QJsonValue::~QJsonValue((QJsonValue *)&stack0xffffffffffffffb0);
  if (*(QString **)(lVar3 + 0x80) != (QString *)0x0) {
    ba_00.m_data = in_RCX;
    ba_00.m_size = *(qsizetype *)(lVar3 + 0x78);
    QString::fromUtf8((QString *)&stack0xffffffffffffff98,*(QString **)(lVar3 + 0x80),ba_00);
    QJsonValue::QJsonValue
              ((QJsonValue *)&stack0xffffffffffffffb0,(QString *)&stack0xffffffffffffff98);
    key_01.m_size = 3;
    key_01.m_data = "tag";
    local_78 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)this,key_01);
    QJsonValueRef::operator=((QJsonValueRef *)&local_78,(QJsonValue *)&stack0xffffffffffffffb0);
    QJsonValue::~QJsonValue((QJsonValue *)&stack0xffffffffffffffb0);
    if (local_68 != (QCborContainerPrivate *)0x0) {
      LOCK();
      (local_68->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (local_68->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_68->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
          ._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68,2,0x10);
      }
    }
  }
  ba_01.m_data = in_RCX;
  ba_01.m_size = *(qsizetype *)(lVar3 + 0x60);
  QString::fromUtf8((QString *)&stack0xffffffffffffff98,*(QString **)(lVar3 + 0x68),ba_01);
  QJsonValue::QJsonValue((QJsonValue *)&stack0xffffffffffffffb0,(QString *)&stack0xffffffffffffff98)
  ;
  key_02.m_size = 10;
  key_02.m_data = "returnType";
  local_78 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)this,key_02);
  QJsonValueRef::operator=((QJsonValueRef *)&local_78,(QJsonValue *)&stack0xffffffffffffffb0);
  QJsonValue::~QJsonValue((QJsonValue *)&stack0xffffffffffffffb0);
  if (local_68 != (QCborContainerPrivate *)0x0) {
    LOCK();
    (local_68->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (local_68->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68,2,0x10);
    }
  }
  if (*(char *)(lVar3 + 0xc0) == '\x01') {
    QJsonValue::QJsonValue((QJsonValue *)&stack0xffffffffffffffb0,true);
    key_03.m_size = 7;
    key_03.m_data = "isConst";
    _local_68 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)this,key_03);
    QJsonValueRef::operator=
              ((QJsonValueRef *)&stack0xffffffffffffff98,(QJsonValue *)&stack0xffffffffffffffb0);
    QJsonValue::~QJsonValue((QJsonValue *)&stack0xffffffffffffffb0);
  }
  local_78.d = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)&local_78);
  if (*(long *)(lVar3 + 0x50) != 0) {
    lVar2 = *(long *)(lVar3 + 0x50) * 0xa8;
    do {
      ArgumentDef::toJson((ArgumentDef *)&stack0xffffffffffffff98);
      QJsonValue::QJsonValue
                ((QJsonValue *)&stack0xffffffffffffffb0,(QJsonObject *)&stack0xffffffffffffff98);
      QJsonArray::append((QJsonArray *)&local_78,(QJsonValue *)&stack0xffffffffffffffb0);
      QJsonValue::~QJsonValue((QJsonValue *)&stack0xffffffffffffffb0);
      QJsonObject::~QJsonObject((QJsonObject *)&stack0xffffffffffffff98);
      lVar2 = lVar2 + -0xa8;
    } while (lVar2 != 0);
  }
  bVar1 = QJsonArray::isEmpty((QJsonArray *)&local_78);
  if (!bVar1) {
    QJsonValue::QJsonValue((QJsonValue *)&stack0xffffffffffffffb0,(QJsonArray *)&local_78);
    key_04.m_size = 9;
    key_04.m_data = "arguments";
    _local_68 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)this,key_04);
    QJsonValueRef::operator=
              ((QJsonValueRef *)&stack0xffffffffffffff98,(QJsonValue *)&stack0xffffffffffffffb0);
    QJsonValue::~QJsonValue((QJsonValue *)&stack0xffffffffffffffb0);
  }
  accessToJson((QJsonObject *)this,*(Access *)(lVar3 + 0xb8));
  if (0 < *(int *)(lVar3 + 0xbc)) {
    QJsonValue::QJsonValue((QJsonValue *)&stack0xffffffffffffffb0,*(int *)(lVar3 + 0xbc));
    key_05.m_size = 8;
    key_05.m_data = "revision";
    _local_68 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)this,key_05);
    QJsonValueRef::operator=
              ((QJsonValueRef *)&stack0xffffffffffffff98,(QJsonValue *)&stack0xffffffffffffffb0);
    QJsonValue::~QJsonValue((QJsonValue *)&stack0xffffffffffffffb0);
  }
  if (*(char *)(lVar3 + 0xc4) == '\x01') {
    QJsonValue::QJsonValue((QJsonValue *)&stack0xffffffffffffffb0,true);
    key_06.m_size = 8;
    key_06.m_data = "isCloned";
    _local_68 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)this,key_06);
    QJsonValueRef::operator=
              ((QJsonValueRef *)&stack0xffffffffffffff98,(QJsonValue *)&stack0xffffffffffffffb0);
    QJsonValue::~QJsonValue((QJsonValue *)&stack0xffffffffffffffb0);
  }
  QJsonArray::~QJsonArray((QJsonArray *)&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
           (QExplicitlySharedDataPointer<QCborContainerPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QJsonObject FunctionDef::toJson(int index) const
{
    QJsonObject fdef;
    fdef["name"_L1] = QString::fromUtf8(name);
    fdef["index"_L1] = index;
    if (!tag.isEmpty())
        fdef["tag"_L1] = QString::fromUtf8(tag);
    fdef["returnType"_L1] = QString::fromUtf8(normalizedType);
    if (isConst)
        fdef["isConst"_L1] = true;

    QJsonArray args;
    for (const ArgumentDef &arg: arguments)
        args.append(arg.toJson());

    if (!args.isEmpty())
        fdef["arguments"_L1] = args;

    accessToJson(&fdef, access);

    if (revision > 0)
        fdef["revision"_L1] = revision;

    if (wasCloned)
        fdef["isCloned"_L1] = true;

    return fdef;
}